

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgEncode_RFC5769SampleIPv6Response_Test::~StunMsgEncode_RFC5769SampleIPv6Response_Test
          (StunMsgEncode_RFC5769SampleIPv6Response_Test *this)

{
  StunMsgEncode_RFC5769SampleIPv6Response_Test *this_local;
  
  ~StunMsgEncode_RFC5769SampleIPv6Response_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StunMsgEncode, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv6)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}